

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cpp
# Opt level: O3

status_t __thiscall libchars::commands::sort(commands *this)

{
  byte *pbVar1;
  undefined8 *puVar2;
  string *psVar3;
  string *psVar4;
  undefined1 auVar5 [8];
  int iVar6;
  long lVar7;
  token *ptVar8;
  token *ptVar9;
  debug *pdVar10;
  long lVar11;
  long lVar12;
  uint32_t *puVar13;
  uint uVar14;
  ulong uVar15;
  token *ptVar16;
  id_t *piVar17;
  ulong uVar18;
  status_t sVar19;
  bool bVar20;
  double __x;
  double __x_00;
  double __x_01;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x_02;
  undefined1 local_68 [8];
  parameters_t par;
  
  if (this->cmd == (command *)0x0) {
    sVar19 = NO_COMMAND;
  }
  else {
    std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::vector
              ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)local_68,
               &this->cmd->par);
    ptVar8 = this->t_par;
    if (ptVar8 == (token *)0x0) {
      lVar7 = 0;
      par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar7 = 0;
      do {
        if (((ptVar8->status & 0x500) == 0) &&
           ((undefined1  [8])
            par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
            _M_impl.super__Vector_impl_data._M_start != local_68)) {
          lVar12 = 0x20;
          uVar18 = 0;
          do {
            auVar5 = local_68;
            if (((*(byte *)((long)&(((token *)local_68)->help)._M_dataplus._M_p + lVar12 + 5) & 1)
                 == 0) &&
               (*(int *)((long)&(((token *)local_68)->name)._M_dataplus._M_p + lVar12) == 4)) {
              puVar2 = (undefined8 *)((long)&(((token *)local_68)->value)._M_dataplus._M_p + lVar12)
              ;
              psVar3 = *(string **)((long)&(((token *)local_68)->value)._M_string_length + lVar12);
              psVar4 = (string *)(ptVar8->value)._M_string_length;
              if ((psVar3 == psVar4) &&
                 ((psVar3 == (string *)0x0 ||
                  (iVar6 = bcmp((void *)*puVar2,(ptVar8->value)._M_dataplus._M_p,(size_t)psVar3),
                  iVar6 == 0)))) {
                ptVar8->status = ptVar8->status | 0x110;
                ptVar8->ttype = FLAG;
                std::__cxx11::string::_M_assign((string *)&ptVar8->name);
                ptVar8->ID = *(id_t *)((long)&(((token *)auVar5)->help)._M_dataplus._M_p + lVar12);
                (ptVar8->value)._M_string_length = 0;
                *(ptVar8->value)._M_dataplus._M_p = '\0';
                pbVar1 = (byte *)((long)&(((token *)auVar5)->help)._M_dataplus._M_p + lVar12 + 5);
                *pbVar1 = *pbVar1 | 1;
                par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((long)&((par.
                                        super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                      super_token).value._M_dataplus._M_p + 1);
                break;
              }
              iVar6 = std::__cxx11::string::compare((ulong)puVar2,0,psVar4);
              if (iVar6 == 0) {
                *(byte *)&ptVar8->status = (byte)ptVar8->status | 4;
              }
            }
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x90;
          } while (uVar18 < (ulong)(((long)par.
                                           super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     (long)local_68 >> 4) * -0x71c71c71c71c71c7));
        }
        lVar7 = lVar7 + 1;
        ptVar8 = ptVar8->next;
      } while (ptVar8 != (token *)0x0);
      for (ptVar8 = this->t_par; ptVar8 != (token *)0x0; ptVar8 = ptVar8->next) {
        if (((ptVar8->status & 0x500) == 0) &&
           ((undefined1  [8])
            par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
            _M_impl.super__Vector_impl_data._M_start != local_68)) {
          lVar12 = 0x20;
          uVar18 = 0;
          do {
            auVar5 = local_68;
            if (((*(byte *)((long)&(((token *)local_68)->help)._M_dataplus._M_p + lVar12 + 5) & 1)
                 == 0) &&
               (*(int *)((long)&(((token *)local_68)->name)._M_dataplus._M_p + lVar12) == 2)) {
              puVar2 = (undefined8 *)((long)&(((token *)local_68)->value)._M_dataplus._M_p + lVar12)
              ;
              psVar3 = *(string **)((long)&(((token *)local_68)->value)._M_string_length + lVar12);
              psVar4 = (string *)(ptVar8->value)._M_string_length;
              if ((psVar3 == psVar4) &&
                 ((psVar3 == (string *)0x0 ||
                  (iVar6 = bcmp((void *)*puVar2,(ptVar8->value)._M_dataplus._M_p,(size_t)psVar3),
                  iVar6 == 0)))) {
                ptVar8->status = ptVar8->status & 0xfffffeeb | 0x110;
                ptVar8->ttype = KEY;
                std::__cxx11::string::_M_assign((string *)&ptVar8->name);
                ptVar8->ID = *(id_t *)((long)&(((token *)auVar5)->help)._M_dataplus._M_p + lVar12);
                if (ptVar8->next == (token *)0x0) {
                  pdVar10 = debug::initialize(0);
                  __x_02 = extraout_XMM0_Qa;
                }
                else {
                  if ((ptVar8->next->status & 0x100) == 0) {
                    (ptVar8->value)._M_string_length = 0;
                    *(ptVar8->value)._M_dataplus._M_p = '\0';
                    ptVar8 = ptVar8->next;
                    ptVar8->status = ptVar8->status | 0x910;
                    ptVar8->ttype = KEY;
                    std::__cxx11::string::_M_assign((string *)&ptVar8->name);
                    ptVar8->ID = *(id_t *)((long)&(((token *)auVar5)->help)._M_dataplus._M_p +
                                          lVar12);
                    ptVar8->vtype =
                         *(id_t *)((long)&(((token *)auVar5)->help)._M_string_length + lVar12);
                    pbVar1 = (byte *)((long)&(((token *)auVar5)->help)._M_dataplus._M_p + lVar12 + 5
                                     );
                    *pbVar1 = *pbVar1 | 1;
                    par.
                    super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)((long)&((par.
                                            super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                          super_token).value._M_dataplus._M_p + 2);
                    break;
                  }
                  pdVar10 = debug::initialize(0);
                  __x_02 = extraout_XMM0_Qa_00;
                }
                debug::log(pdVar10,__x_02);
                (ptVar8->value)._M_string_length = 0;
                *(ptVar8->value)._M_dataplus._M_p = '\0';
                sVar19 = MISSING_VALUE;
                goto LAB_00112133;
              }
              iVar6 = std::__cxx11::string::compare((ulong)puVar2,0,psVar4);
              if (iVar6 == 0) {
                *(byte *)&ptVar8->status = (byte)ptVar8->status | 4;
              }
            }
            uVar18 = uVar18 + 1;
            lVar12 = lVar12 + 0x90;
          } while (uVar18 < (ulong)(((long)par.
                                           super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                           ._M_impl.super__Vector_impl_data._M_start -
                                     (long)local_68 >> 4) * -0x71c71c71c71c71c7));
        }
      }
    }
    uVar18 = ((long)par.
                    super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)local_68 >> 4) *
             -0x71c71c71c71c71c7;
    if ((undefined1  [8])
        par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
        super__Vector_impl_data._M_start == local_68) {
      lVar12 = 0;
    }
    else {
      lVar11 = uVar18 + (uVar18 == 0);
      puVar13 = &((token *)local_68)->status;
      lVar12 = 0;
      do {
        if (puVar13[-0xb] == VALUE) {
          lVar12 = lVar12 + (ulong)((*puVar13 >> 0xc & 1) != 0);
        }
        else if ((puVar13[-0xb] == KEY) && ((*puVar13 & 0x1100) == 0x1000)) {
          pdVar10 = debug::initialize(0);
          debug::log(pdVar10,__x_01);
          sVar19 = TOO_FEW_ARGS;
          goto LAB_00112133;
        }
        puVar13 = puVar13 + 0x24;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    lVar7 = lVar7 - (long)par.
                          super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    bVar20 = lVar7 != 0;
    ptVar8 = this->t_par;
    ptVar9 = ptVar8;
    if (ptVar8 != (token *)0x0 && bVar20) {
      uVar15 = 0;
      ptVar16 = ptVar8;
      do {
        while ((ptVar16->status >> 8 & 1) == 0) {
          bVar20 = true;
          if (uVar18 <= uVar15) goto joined_r0x00111e37;
          piVar17 = &(((pointer)((long)local_68 + uVar15 * 0x90))->super_token).vtype;
          while (((*piVar17 & 0x10000000000) != 0 || (piVar17[-0xc] != VALUE))) {
            uVar15 = uVar15 + 1;
            piVar17 = piVar17 + 0x24;
            if (uVar18 - uVar15 == 0) goto joined_r0x00111e37;
          }
          ptVar16->status = ptVar16->status | 0x910;
          ptVar16->ttype = VALUE;
          ptVar16->vtype = *piVar17;
          ptVar16->ID = piVar17[-2];
          uVar14 = piVar17[-1];
          piVar17[-1] = uVar14 | 0x100;
          lVar12 = lVar12 + ((int)(uVar14 << 0x13) >> 0x1f);
          lVar7 = lVar7 + -1;
          bVar20 = lVar7 != 0;
          if ((lVar7 == 0) || (ptVar16 == (token *)0x0)) goto joined_r0x00111e37;
        }
        ptVar16 = ptVar16->next;
      } while (ptVar16 != (token *)0x0);
      bVar20 = true;
    }
joined_r0x00111e37:
    for (; ptVar9 != (token *)0x0; ptVar9 = ptVar9->next) {
      uVar14 = ptVar9->status;
      while ((uVar14 >> 8 & 1) == 0) {
        uVar14 = (uint)((uVar14 & 4) == 0) * 2 | uVar14 | 0x110;
        ptVar9->status = uVar14;
        ptVar9->ttype = UNKNOWN;
      }
    }
    if (bVar20) {
      pdVar10 = debug::initialize(0);
      debug::log(pdVar10,__x);
      sVar19 = TOO_MANY_ARGS;
    }
    else if (lVar12 == 0) {
      if (ptVar8 == (token *)0x0) {
        ptVar8 = this->t_cmd;
      }
      do {
        ptVar9 = ptVar8;
        sVar19 = VALID_COMMAND;
        if (ptVar9 == (token *)0x0) goto LAB_00112133;
        ptVar8 = ptVar9->next;
      } while (ptVar9->next != (token *)0x0);
      sVar19 = VALID_COMMAND;
      if ((undefined1  [8])
          par.super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>._M_impl.
          super__Vector_impl_data._M_start != local_68) {
        lVar7 = 0;
        uVar18 = 0;
        do {
          auVar5 = local_68;
          if ((*(uint *)((long)&((token *)local_68)->status + lVar7) & 0x8100) == 0x8000) {
            iVar6 = *(int *)((long)&((token *)local_68)->ttype + lVar7);
            if (iVar6 == 2) {
              ptVar8 = (token *)operator_new(0x90);
              token::token(ptVar8,*(type_t *)((long)&((token *)auVar5)->ttype + lVar7),
                           *(id_t *)((long)&((token *)auVar5)->ID + lVar7),
                           *(id_t *)((long)&((token *)auVar5)->vtype + lVar7),
                           *(char **)((long)&(((token *)auVar5)->name)._M_dataplus._M_p + lVar7));
              pbVar1 = (byte *)((long)&ptVar8->status + 1);
              *pbVar1 = *pbVar1 | 1;
              ptVar9->next = ptVar8;
              if (this->t_par == (token *)0x0) {
                this->t_par = ptVar8;
              }
              ptVar9 = (token *)operator_new(0x90);
              token::token(ptVar9,*(type_t *)((long)&((token *)auVar5)->ttype + lVar7),
                           *(id_t *)((long)&((token *)auVar5)->ID + lVar7),
                           *(id_t *)((long)&((token *)auVar5)->vtype + lVar7),
                           *(char **)((long)&(((token *)auVar5)->name)._M_dataplus._M_p + lVar7));
              pbVar1 = (byte *)((long)&ptVar9->status + 1);
              *pbVar1 = *pbVar1 | 0x49;
              std::__cxx11::string::_M_assign((string *)ptVar9);
              ptVar8->next = ptVar9;
            }
            else if (iVar6 == 3) {
              ptVar8 = (token *)operator_new(0x90);
              token::token(ptVar8,*(type_t *)((long)&((token *)auVar5)->ttype + lVar7),
                           *(id_t *)((long)&((token *)auVar5)->ID + lVar7),
                           *(id_t *)((long)&((token *)auVar5)->vtype + lVar7),(char *)0x0);
              pbVar1 = (byte *)((long)&ptVar8->status + 1);
              *pbVar1 = *pbVar1 | 0x41;
              std::__cxx11::string::_M_assign((string *)ptVar8);
              ptVar9->next = ptVar8;
              ptVar9 = ptVar8;
              if (this->t_par == (token *)0x0) {
                this->t_par = ptVar8;
              }
            }
          }
          uVar18 = uVar18 + 1;
          lVar7 = lVar7 + 0x90;
        } while (uVar18 < (ulong)(((long)par.
                                         super__Vector_base<libchars::parameter,_std::allocator<libchars::parameter>_>
                                         ._M_impl.super__Vector_impl_data._M_start - (long)local_68
                                  >> 4) * -0x71c71c71c71c71c7));
        sVar19 = VALID_COMMAND;
      }
    }
    else {
      pdVar10 = debug::initialize(0);
      debug::log(pdVar10,__x_00);
      sVar19 = TOO_FEW_ARGS;
    }
LAB_00112133:
    std::vector<libchars::parameter,_std::allocator<libchars::parameter>_>::~vector
              ((vector<libchars::parameter,_std::allocator<libchars::parameter>_> *)local_68);
  }
  return sVar19;
}

Assistant:

commands::status_t commands::sort()
    {
        if (cmd == NULL)
            return NO_COMMAND;

        size_t p_idx = 0;
        size_t n_assigned = 0;
        size_t n_available = 0;
        token *T = NULL;
        parameters_t par = cmd->par;

        // find FLAG parameters
        T = t_par;
        while (T != NULL) {
            ++n_available;
            if ((T->status & (token::IS_QUOTED | token::SORTED)) == 0) {
                for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                    parameter &P = par[p_idx];
                    if (!(P.status & token::SORTED) && P.ttype == token::FLAG) {
                        if (P.name == T->value) {
                            // full match on flag name
                            T->status |= (token::SORTED | token::IN_STRING);
                            T->ttype = token::FLAG;
                            T->name = P.name;
                            T->ID = P.ID;
                            T->value.clear();
                            P.status |= token::SORTED;
                            ++n_assigned;
                            break;
                        }
                        else if (P.name.compare(0, T->value.length(), T->value) == 0) {
                            // partial match on flag name
                            T->status |= token::PARTIAL_ARG;
                        }
                    }
                }
            }
            T = T->next;
        }

        // find values for KEY parameters; error if corresponding value not available
        T = t_par;
        while (T != NULL) {
            if ((T->status & (token::IS_QUOTED | token::SORTED)) == 0) {
                for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                    parameter &P = par[p_idx];
                    if (!(P.status & token::SORTED) && P.ttype == token::KEY) {
                        if (P.name == T->value) {
                            // full match on key name
                            T->status &= ~token::PARTIAL_ARG;
                            T->status |= (token::SORTED | token::IN_STRING);
                            T->ttype = token::KEY;
                            T->name = P.name;
                            T->ID = P.ID;
                            if (T->next == NULL) {
                                LC_LOG_VERBOSE("KEY(%s): missing value", P.name.c_str());
                                T->value.clear();
                                return MISSING_VALUE;
                            }
                            else if (T->next->status & token::SORTED) {
                                LC_LOG_VERBOSE("KEY(%s): missing value", P.name.c_str());
                                T->value.clear();
                                return MISSING_VALUE;
                            }
                            else {
                                T->value.clear();
                                T = T->next;
                                T->status |= (token::SORTED | token::IN_STRING | token::IS_VALUE);
                                T->ttype = token::KEY;
                                T->name = P.name;
                                T->ID = P.ID;
                                T->vtype = P.vtype;
                                P.status |= token::SORTED;
                                n_assigned += 2;
                                break;
                            }
                        }
                        else if (P.name.compare(0, T->value.length(), T->value) == 0) {
                            // partial match on key name
                            T->status |= token::PARTIAL_ARG;
                        }
                    }
                }
            }
            T = T->next;
        }

        // make sure all mandatory KEY parameters were specified
        size_t n_pm = 0, n_po = 0;
        for (p_idx = 0; p_idx < par.size(); ++p_idx) {
            parameter &P = par[p_idx];
            switch (P.ttype) {
            case token::KEY:
                if ((P.status & (token::SORTED | token::MANDATORY)) == token::MANDATORY) {
                    LC_LOG_VERBOSE("KEY(%s): missing key", P.name.c_str());
                    return TOO_FEW_ARGS;
                }
                break;
            case token::VALUE:
                if (P.status & token::MANDATORY) {
                    ++n_pm;
                }
                else {
                    ++n_po;
                }
                break;
            default:;
            }
        }

        // extract positional arguments (type = VALUE)
        size_t n_arguments = n_available - n_assigned;
        p_idx = 0;
        T = t_par;
        while (n_arguments > 0 && T != NULL) {
            while (T != NULL && (T->status & token::SORTED))
                T = T->next;
            if (T == NULL)
                break;
            while (p_idx < par.size() && ((par[p_idx].status & token::SORTED) || par[p_idx].ttype != token::VALUE))
                ++p_idx;
            if (p_idx >= par.size())
                break;
            parameter& P = par[p_idx];
            T->status |= (token::SORTED | token::IN_STRING | token::IS_VALUE);
            T->ttype = token::VALUE;
            T->vtype = P.vtype;
            T->ID = P.ID;
            P.status |= token::SORTED;
            --n_arguments;
            if (P.status & token::MANDATORY) --n_pm; else --n_po;
        }

        // mark remaining arguments as invalid (if not a partial key match)
        T = t_par;
        while (T != NULL) {
            while (T != NULL && (T->status & token::SORTED))
                T = T->next;
            if (T == NULL)
                break;
            T->status |= (token::SORTED | token::IN_STRING);
            if (!(T->status & token::PARTIAL_ARG))
                T->status |= token::INVALID;
            T->ttype = token::UNKNOWN;
        }

        if (n_arguments > 0) {
            LC_LOG_VERBOSE("Too many arguments [%zu extra]",n_arguments);
            return TOO_MANY_ARGS;
        }
        else if (n_pm > 0) {
            LC_LOG_VERBOSE("Missing mandatory arguments [%zu remain]",n_pm);
            return TOO_FEW_ARGS;
        }

        // add unspecified optional parameters (with default values) to token list
        token *t_head = (t_par != NULL) ? t_par : t_cmd;
        while (t_head != NULL && t_head->next != NULL)
            t_head = t_head->next;

        if (t_head != NULL) {
            for (p_idx = 0; p_idx < par.size(); ++p_idx) {
                parameter &P = par[p_idx];
                if ((P.status & (token::SORTED | token::DEFAULT_SET)) == token::DEFAULT_SET) {
                    switch (P.ttype) {
                    case token::FLAG:
                        // missing flag = FALSE
                        break;
                    case token::VALUE:
                        T = new token(P.ttype,P.ID,P.vtype);
                        T->status |= (token::SORTED | token::DEFAULT_USED);
                        T->value = P.value;
                        t_head->next = T;
                        t_head = T;
                        if (t_par == NULL)
                            t_par = T;
                        break;
                    case token::KEY:
                        T = new token(P.ttype,P.ID,P.vtype,P.name.c_str());
                        T->status |= (token::SORTED);
                        t_head->next = T;
                        t_head = T;
                        if (t_par == NULL)
                            t_par = T;
                        T = new token(P.ttype,P.ID,P.vtype,P.name.c_str());
                        T->status |= (token::SORTED | token::IS_VALUE | token::DEFAULT_USED);
                        T->value = P.value;
                        t_head->next = T;
                        t_head = T;
                        break;
                    default:;
                    }
                }
            }
        }

        return VALID_COMMAND;
    }